

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall
mp::BasicSolver::InitMetaInfoAndOptions::BoolOption::SetValue(BoolOption *this,LongLong value)

{
  char *__s;
  InvalidOptionValue *this_00;
  size_t sVar1;
  StringRef name;
  
  if ((ulong)value < 2) {
    *this->value_ = SUB81(value,0);
    return;
  }
  this_00 = (InvalidOptionValue *)__cxa_allocate_exception(0x18);
  __s = (this->super_TypedSolverOption<int>).super_SolverOption.name_._M_dataplus._M_p;
  sVar1 = strlen(__s);
  name.size_ = sVar1;
  name.data_ = __s;
  InvalidOptionValue::InvalidOptionValue<long_long>(this_00,name,value,(StringRef)ZEXT816(0x2287d0))
  ;
  __cxa_throw(this_00,&InvalidOptionValue::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void SetValue(fmt::LongLong value) {
      if (value != 0 && value != 1)
        throw InvalidOptionValue(name(), value);
      value_ = value != 0;
    }